

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

DecodedResult * bech32::decode(DecodedResult *__return_storage_ptr__,string *bstring)

{
  char *pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  size_type i;
  uint64_t uVar7;
  ulong uVar8;
  runtime_error *prVar9;
  char *pcVar10;
  size_type sVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  size_type sVar15;
  long lVar16;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dp;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  string hrp;
  string dpstr;
  
  uVar8 = bstring->_M_string_length;
  if (uVar8 < 8) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"bech32 string too short");
    goto LAB_0010377b;
  }
  if (0x5a < uVar8) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"bech32 string too long");
    goto LAB_0010377b;
  }
  _Var2._M_current = (bstring->_M_dataplus)._M_p;
  bVar4 = std::
          any_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)noexcept>
                    (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(_Var2._M_current + uVar8),isupper);
  _Var2._M_current = (bstring->_M_dataplus)._M_p;
  bVar5 = std::
          any_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int(*)(int)noexcept>
                    (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(_Var2._M_current + bstring->_M_string_length),islower);
  if ((bVar4) && (bVar5)) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"bech32 string is mixed case");
    goto LAB_0010377b;
  }
  pcVar3 = (bstring->_M_dataplus)._M_p;
  sVar11 = bstring->_M_string_length;
  pcVar1 = pcVar3 + sVar11;
  pcVar13 = pcVar3 + 1;
  lVar12 = (long)sVar11 >> 2;
  sVar15 = sVar11;
  for (lVar16 = lVar12; 0 < lVar16; lVar16 = lVar16 + -1) {
    if ((byte)(pcVar13[-1] + 0x81U) < 0xa2) {
      pcVar13 = pcVar13 + -1;
      goto LAB_0010338a;
    }
    if ((byte)(*pcVar13 + 0x81U) < 0xa2) goto LAB_0010338a;
    if ((byte)(pcVar13[1] + 0x81U) < 0xa2) {
      pcVar13 = pcVar13 + 1;
      goto LAB_0010338a;
    }
    if ((byte)(pcVar13[2] + 0x81U) < 0xa2) {
      pcVar13 = pcVar13 + 2;
      goto LAB_0010338a;
    }
    pcVar13 = pcVar13 + 4;
    sVar15 = sVar15 - 4;
  }
  pcVar10 = pcVar13 + -1;
  if (sVar15 == 1) {
LAB_0010365d:
    pcVar13 = pcVar10;
    if (0xa1 < (byte)(*pcVar10 + 0x81U)) {
      pcVar13 = pcVar1;
    }
LAB_0010338a:
    if (pcVar13 != pcVar1) {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"bech32 string has value out of range");
      goto LAB_0010377b;
    }
  }
  else {
    if (sVar15 == 3) {
      pcVar14 = pcVar13;
      pcVar13 = pcVar10;
      if (0xa1 < (byte)(*pcVar10 + 0x81U)) goto LAB_00103646;
      goto LAB_0010338a;
    }
    pcVar14 = pcVar10;
    if (sVar15 == 2) {
LAB_00103646:
      pcVar13 = pcVar14;
      if (0xa1 < (byte)(*pcVar14 + 0x81U)) {
        pcVar10 = pcVar14 + 1;
        goto LAB_0010365d;
      }
      goto LAB_0010338a;
    }
  }
  pcVar13 = pcVar3 + 1;
  for (; 0 < lVar12; lVar12 = lVar12 + -1) {
    if (pcVar13[-1] == '1') {
      pcVar10 = pcVar13 + -1;
      goto LAB_00103402;
    }
    pcVar10 = pcVar13;
    if (*pcVar13 == '1') goto LAB_00103402;
    if (pcVar13[1] == '1') {
      pcVar10 = pcVar13 + 1;
      goto LAB_00103402;
    }
    if (pcVar13[2] == '1') {
      pcVar10 = pcVar13 + 2;
      goto LAB_00103402;
    }
    pcVar13 = pcVar13 + 4;
    sVar11 = sVar11 - 4;
  }
  pcVar10 = pcVar13 + -1;
  if (sVar11 == 1) {
LAB_00103677:
    if (*pcVar10 != '1') {
      pcVar10 = pcVar1;
    }
LAB_00103402:
    if (pcVar10 != pcVar1) {
      anon_unknown.dwarf_704a::findSeparatorPosition(bstring);
      std::__cxx11::string::substr((ulong)&hrp,(ulong)bstring);
      uVar7 = anon_unknown.dwarf_704a::findSeparatorPosition(bstring);
      std::__cxx11::string::substr((ulong)&dpstr,(ulong)bstring);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&dp,bstring->_M_string_length - (uVar7 + 1),(allocator_type *)&local_78);
      for (uVar8 = 0; uVar8 < dpstr._M_string_length; uVar8 = uVar8 + 1) {
        dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = dpstr._M_dataplus._M_p[uVar8];
      }
      std::__cxx11::string::~string((string *)&dpstr);
      anon_unknown.dwarf_704a::rejectHRPTooShort(&hrp);
      anon_unknown.dwarf_704a::rejectHRPTooLong(&hrp);
      if ((ulong)((long)dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                        .super__Vector_impl_data._M_finish -
                 (long)dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) < 6) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"data part must be at least six characters");
      }
      else {
        anon_unknown.dwarf_704a::convertToLowercase(&hrp);
        while( true ) {
          if (dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
              dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            anon_unknown.dwarf_704a::expandHrp
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&hrp);
            anon_unknown.dwarf_704a::cat
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dpstr,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&dp);
            uVar6 = anon_unknown.dwarf_704a::polymod
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dpstr);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dpstr);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_78);
            if (uVar6 == 0x2bc830a3) {
              anon_unknown.dwarf_704a::stripChecksum(&dp);
              __return_storage_ptr__->encoding = Bech32m;
              std::__cxx11::string::string((string *)&__return_storage_ptr__->hrp,(string *)&hrp);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&__return_storage_ptr__->dp,&dp);
            }
            else {
              anon_unknown.dwarf_704a::expandHrp
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&hrp);
              anon_unknown.dwarf_704a::cat
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dpstr,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,&dp);
              uVar6 = anon_unknown.dwarf_704a::polymod
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dpstr);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dpstr);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_78);
              if (uVar6 == 1) {
                anon_unknown.dwarf_704a::stripChecksum(&dp);
                __return_storage_ptr__->encoding = Bech32;
                std::__cxx11::string::string((string *)&__return_storage_ptr__->hrp,(string *)&hrp);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          (&__return_storage_ptr__->dp,&dp);
              }
              else {
                *(undefined8 *)__return_storage_ptr__ = 0;
                (__return_storage_ptr__->hrp)._M_dataplus._M_p = (pointer)0x0;
                *(undefined8 *)((long)&(__return_storage_ptr__->hrp).field_2 + 8) = 0;
                (__return_storage_ptr__->hrp)._M_string_length = 0;
                (__return_storage_ptr__->hrp).field_2._M_allocated_capacity = 0;
                (__return_storage_ptr__->hrp)._M_dataplus._M_p =
                     (pointer)&(__return_storage_ptr__->hrp).field_2;
                (__return_storage_ptr__->hrp).field_2._M_local_buf[0] = '\0';
                (__return_storage_ptr__->dp).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (__return_storage_ptr__->dp).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                (__return_storage_ptr__->dp).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              }
            }
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            std::__cxx11::string::~string((string *)&hrp);
            return __return_storage_ptr__;
          }
          if ((long)(char)*dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start < 0) break;
          if ((anonymous_namespace)::reverse_charset
              [(char)*dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start] == 0xff) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"data part contains invalid character");
            goto LAB_001036b9;
          }
          *dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start =
               (anonymous_namespace)::reverse_charset
               [(char)*dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start];
          dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"data part contains character value out of range");
      }
LAB_001036b9:
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (sVar11 == 3) {
      if (*pcVar10 != '1') goto LAB_001033f6;
      goto LAB_00103402;
    }
    pcVar13 = pcVar10;
    if (sVar11 == 2) {
LAB_001033f6:
      pcVar10 = pcVar13;
      if (*pcVar13 != '1') {
        pcVar10 = pcVar13 + 1;
        goto LAB_00103677;
      }
      goto LAB_00103402;
    }
  }
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"bech32 string is missing separator character");
LAB_0010377b:
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

DecodedResult decode(const std::string & bstring) {
        rejectBStringThatIsntWellFormed(bstring);
        std::string hrp = extractHumanReadablePart(bstring);
        std::vector<unsigned char> dp = extractDataPart(bstring);
        rejectHRPTooShort(hrp);
        rejectHRPTooLong(hrp);
        rejectDPTooShort(dp);
        convertToLowercase(hrp);
        mapDP(dp);
        if (verifyChecksum(hrp, dp)) {
            stripChecksum(dp);
            return {bech32::Encoding::Bech32m, hrp, dp};
        }
        else if (verifyChecksumUsingOriginalConstant(hrp, dp)) {
            stripChecksum(dp);
            return {bech32::Encoding::Bech32, hrp, dp};
        }
        else {
            return DecodedResult();
        }
    }